

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

int __thiscall
EnvironmentNAVXYTHETALAT::GetTrueCost(EnvironmentNAVXYTHETALAT *this,int parentID,int childID)

{
  pointer ppEVar1;
  EnvNAVXYTHETALATHashEntry_t *pEVar2;
  EnvNAVXYTHETALATHashEntry_t *pEVar3;
  EnvNAVXYTHETALATAction_t *pEVar4;
  int iVar5;
  int iVar6;
  code *pcVar7;
  int *piVar8;
  SBPL_Exception *this_00;
  uint uVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  
  if (0 < (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth) {
    ppEVar1 = (this->StateID2CoordTable).
              super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar2 = ppEVar1[childID];
    pEVar3 = ppEVar1[parentID];
    lVar12 = 0;
    lVar11 = 0;
    do {
      pEVar4 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.ActionsV
               [(uint)(int)pEVar3->Theta];
      uVar9 = (int)(&pEVar4->dX)[lVar12] + pEVar3->X;
      uVar13 = (int)(&pEVar4->dY)[lVar12] + pEVar3->Y;
      iVar5 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x24])
                        (this,(ulong)(uint)(int)(&pEVar4->endtheta)[lVar12]);
      iVar6 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x41])(this,(ulong)uVar9,(ulong)uVar13);
      if ((char)iVar6 != '\0') {
        pcVar7 = (code *)this->GetHashEntry;
        plVar10 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                  super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                          *(long *)&this->field_0x1c8);
        if (((ulong)pcVar7 & 1) != 0) {
          pcVar7 = *(code **)(pcVar7 + *plVar10 + -1);
        }
        piVar8 = (int *)(*pcVar7)(plVar10,uVar9,uVar13,iVar5);
        if ((piVar8 != (int *)0x0) && (*piVar8 == pEVar2->stateID)) {
          iVar5 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                    _vptr_DiscreteSpaceInformation[0x36])
                            (this,(ulong)(uint)pEVar3->X,(ulong)(uint)pEVar3->Y,
                             (ulong)(uint)(int)pEVar3->Theta,&pEVar4->aind + lVar12);
          if (999999999 < iVar5) {
            iVar5 = -1;
          }
          return iVar5;
        }
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x68;
    } while (lVar11 < (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth);
  }
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception
            (this_00,
             "This should never happen! we didn\'t find the state we need to get the true cost for!"
            );
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int EnvironmentNAVXYTHETALAT::GetTrueCost(int parentID, int childID)
{
    EnvNAVXYTHETALATHashEntry_t* fromHash = StateID2CoordTable[parentID];
    EnvNAVXYTHETALATHashEntry_t* toHash = StateID2CoordTable[childID];

    for (int i = 0; i < EnvNAVXYTHETALATCfg.actionwidth; i++) {
        EnvNAVXYTHETALATAction_t* nav3daction = &EnvNAVXYTHETALATCfg.ActionsV[(unsigned int)fromHash->Theta][i];
        int newX = fromHash->X + nav3daction->dX;
        int newY = fromHash->Y + nav3daction->dY;
        int newTheta = normalizeDiscAngle(nav3daction->endtheta);

        // skip the invalid cells
        if (!IsValidCell(newX, newY)) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* hash;
        if ((hash = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
            continue;
        }
        if (hash->stateID != toHash->stateID) {
            continue;
        }

        // get cost
        int cost = GetActionCost(fromHash->X, fromHash->Y, fromHash->Theta, nav3daction);

        if (cost >= INFINITECOST) {
            return -1;
        }
        return cost;
    }
    throw SBPL_Exception("This should never happen! we didn't find the state we need to get the true cost for!");
    return -1;
}